

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

uint32_t read_frame_header_obu
                   (AV1Decoder *pbi,aom_read_bit_buffer *rb,uint8_t *data,uint8_t **p_data_end,
                   int trailing_bits_present)

{
  uint32_t uVar1;
  long *in_RCX;
  long in_RDX;
  long in_RDI;
  aom_read_bit_buffer *unaff_retaddr;
  AV1_COMMON *cm;
  uint32_t hdr_size;
  
  uVar1 = av1_decode_frame_headers_and_setup
                    ((AV1Decoder *)cm,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  if (*(int *)(in_RDI + 0x3d48) != 0) {
    *in_RCX = in_RDX + (ulong)uVar1;
  }
  return uVar1;
}

Assistant:

static uint32_t read_frame_header_obu(AV1Decoder *pbi,
                                      struct aom_read_bit_buffer *rb,
                                      const uint8_t *data,
                                      const uint8_t **p_data_end,
                                      int trailing_bits_present) {
  const uint32_t hdr_size =
      av1_decode_frame_headers_and_setup(pbi, rb, trailing_bits_present);
  const AV1_COMMON *cm = &pbi->common;
  if (cm->show_existing_frame) {
    *p_data_end = data + hdr_size;
  }
  return hdr_size;
}